

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void redirect_to_https_port(mg_connection *conn,int port)

{
  int iVar1;
  char *define_proto;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  size_t slen2;
  size_t slen1;
  int redirect_code;
  char *expect_proto;
  char local_2018 [4];
  int truncated;
  char target_url [8192];
  int port_local;
  mg_connection *conn_local;
  
  bVar3 = false;
  define_proto = "https";
  if (conn->protocol_type == 1) {
    define_proto = "wss";
  }
  conn->must_close = 1;
  target_url._8188_4_ = port;
  iVar1 = mg_construct_local_link(conn,local_2018,0x2000,define_proto,port,(char *)0x0);
  if (iVar1 < 0) {
    bVar3 = true;
  }
  else if ((conn->request_info).query_string != (char *)0x0) {
    sVar2 = strlen(local_2018);
    __n = strlen((conn->request_info).query_string);
    bVar3 = 0x1fff < sVar2 + __n + 2;
    if (!bVar3) {
      local_2018[sVar2] = '?';
      memcpy(local_2018 + sVar2 + 1,(conn->request_info).query_string,__n);
      local_2018[sVar2 + __n + 1] = '\0';
    }
  }
  if (bVar3) {
    mg_send_http_error(conn,500,"%s","Redirect URL too long");
  }
  else {
    mg_send_http_redirect(conn,local_2018,0x134);
  }
  return;
}

Assistant:

static void
redirect_to_https_port(struct mg_connection *conn, int port)
{
	char target_url[MG_BUF_LEN];
	int truncated = 0;
	const char *expect_proto =
	    (conn->protocol_type == PROTOCOL_TYPE_WEBSOCKET) ? "wss" : "https";

	/* Use "308 Permanent Redirect" */
	int redirect_code = 308;

	/* In any case, close the current connection */
	conn->must_close = 1;

	/* Send host, port, uri and (if it exists) ?query_string */
	if (mg_construct_local_link(
	        conn, target_url, sizeof(target_url), expect_proto, port, NULL)
	    < 0) {
		truncated = 1;
	} else if (conn->request_info.query_string != NULL) {
		size_t slen1 = strlen(target_url);
		size_t slen2 = strlen(conn->request_info.query_string);
		if ((slen1 + slen2 + 2) < sizeof(target_url)) {
			target_url[slen1] = '?';
			memcpy(target_url + slen1 + 1,
			       conn->request_info.query_string,
			       slen2);
			target_url[slen1 + slen2 + 1] = 0;
		} else {
			truncated = 1;
		}
	}

	/* Check overflow in location buffer (will not occur if MG_BUF_LEN
	 * is used as buffer size) */
	if (truncated) {
		mg_send_http_error(conn, 500, "%s", "Redirect URL too long");
		return;
	}

	/* Use redirect helper function */
	mg_send_http_redirect(conn, target_url, redirect_code);
}